

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
* __thiscall
helics::CommonCore::createBasicHandle
          (CommonCore *this,GlobalFederateId global_federateId,LocalFederateId local_federateId,
          InterfaceType HandleType,string_view key,string_view type,string_view units,uint16_t flags
          )

{
  type p_Var1;
  
  p_Var1 = gmlc::libguarded::ordered_guarded<helics::HandleManager,std::shared_mutex>::
           modify<helics::CommonCore::createBasicHandle(helics::GlobalFederateId,helics::LocalFederateId,helics::InterfaceType,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,unsigned_short)::__0>
                     ((ordered_guarded<helics::HandleManager,_std::shared_mutex> *)&stack0x00000018,
                      (anon_class_56_7_68b0f2b6 *)&stack0x00000008);
  return p_Var1;
}

Assistant:

const BasicHandleInfo& CommonCore::createBasicHandle(GlobalFederateId global_federateId,
                                                     LocalFederateId local_federateId,
                                                     InterfaceType HandleType,
                                                     std::string_view key,
                                                     std::string_view type,
                                                     std::string_view units,
                                                     uint16_t flags)
{
    return handles.modify([&](auto& hand) -> const BasicHandleInfo& {
        auto& hndl = hand.addHandle(global_federateId, HandleType, key, type, units);
        hndl.local_fed_id = local_federateId;
        hndl.flags = flags;
        return hndl;
    });
}